

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmdifc.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  double dVar2;
  double dVar3;
  fcndata_t data;
  double fjac1 [45];
  double covfac;
  double y [15];
  int n;
  int m;
  int k;
  double wa4 [15];
  double wa3 [3];
  double wa2 [3];
  double wa1 [3];
  double qtf [3];
  double fjac [45];
  double diag [3];
  double fvec [15];
  double x [3];
  double fnorm;
  double factor;
  double epsfcn;
  double gtol;
  double xtol;
  double ftol;
  int ipvt [3];
  int ldfjac;
  int nfev;
  int info;
  int nprint;
  int mode;
  int maxfev;
  int j;
  int i;
  double *x_00;
  int n_00;
  double local_5b8 [14];
  double in_stack_fffffffffffffab8;
  double in_stack_fffffffffffffac0;
  double in_stack_fffffffffffffac8;
  double in_stack_fffffffffffffad0;
  double in_stack_fffffffffffffad8;
  double *in_stack_fffffffffffffae0;
  double *in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf4;
  void *in_stack_fffffffffffffaf8;
  cminpack_func_mn in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb20;
  double *in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb38;
  int *in_stack_fffffffffffffb40;
  double *in_stack_fffffffffffffb48;
  int in_stack_fffffffffffffb50;
  int *in_stack_fffffffffffffb58;
  double *in_stack_fffffffffffffb60;
  double *in_stack_fffffffffffffb68;
  double *in_stack_fffffffffffffb70;
  double *in_stack_fffffffffffffb78;
  double *in_stack_fffffffffffffb80;
  undefined1 local_448 [132];
  undefined4 local_3c4;
  undefined4 local_3c0;
  int local_3bc;
  double local_3b8 [24];
  double local_2f8 [8];
  double local_2b8 [46];
  undefined1 local_148 [160];
  double local_a8 [4];
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  double local_70;
  double local_68;
  int local_60 [3];
  int local_54;
  uint local_50;
  uint local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  uint local_3c;
  uint local_38;
  undefined4 local_34;
  
  local_34 = 0;
  local_3c0 = 0xf;
  local_3c4 = 3;
  memcpy(local_448,&DAT_00106020,0x78);
  local_a8[0] = 1.0;
  local_a8[1] = 1.0;
  local_a8[2] = 1.0;
  local_54 = 0xf;
  dVar2 = dpmpar(1);
  local_68 = sqrt(dVar2);
  dVar2 = dpmpar(1);
  local_70 = sqrt(dVar2);
  local_78 = 0;
  local_40 = 800;
  local_80 = 0;
  local_44 = 1;
  local_88 = 0x4059000000000000;
  local_48 = 0;
  n_00 = (int)((ulong)local_148 >> 0x20);
  x_00 = local_3b8;
  local_4c = lmdif(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf4,
                   in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                   in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                   in_stack_fffffffffffffb20,in_stack_fffffffffffffac0,in_stack_fffffffffffffb28,
                   in_stack_fffffffffffffb30,in_stack_fffffffffffffab8,in_stack_fffffffffffffb38,
                   in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,
                   in_stack_fffffffffffffb58,in_stack_fffffffffffffb60,in_stack_fffffffffffffb68,
                   in_stack_fffffffffffffb70,in_stack_fffffffffffffb78,in_stack_fffffffffffffb80);
  local_a8[3] = enorm(n_00,x_00);
  printf("      final l2 norm of the residuals%15.7g\n\n",local_a8[3]);
  printf("      number of function evaluations%10i\n\n",(ulong)local_50);
  printf("      exit parameter                %10i\n\n",(ulong)local_4c);
  printf("      final approximate solution\n");
  for (local_3c = 0; (int)local_3c < 3; local_3c = local_3c + 1) {
    pcVar1 = "";
    if ((int)local_3c % 3 == 0) {
      pcVar1 = "\n     ";
    }
    printf("%s%15.7g",local_a8[(int)local_3c],pcVar1);
  }
  printf("\n");
  local_68 = dpmpar(1);
  dVar2 = (local_a8[3] * local_a8[3]) / 12.0;
  memcpy(local_5b8,local_2b8,0x168);
  covar(3,local_5b8,local_54,local_60,local_68,local_2f8);
  local_3bc = covar1(0xf,3,local_a8[3] * local_a8[3],local_2b8,local_54,local_60,local_68,local_2f8)
  ;
  printf("      covariance\n");
  for (local_38 = 0; (int)local_38 < 3; local_38 = local_38 + 1) {
    for (local_3c = 0; (int)local_3c < 3; local_3c = local_3c + 1) {
      pcVar1 = "";
      if ((int)local_3c % 3 == 0) {
        pcVar1 = "\n     ";
      }
      printf("%s%15.7g",local_2b8[(int)(local_38 * local_54 + local_3c)],pcVar1);
    }
  }
  printf("\n");
  if (local_3bc == 3) {
    for (local_38 = 0; (int)local_38 < 3; local_38 = local_38 + 1) {
      for (local_3c = 0; (int)local_3c < 3; local_3c = local_3c + 1) {
        dVar3 = local_5b8[(int)(local_38 * local_54 + local_3c)] * dVar2;
        if ((local_2b8[(int)(local_38 * local_54 + local_3c)] != dVar3) ||
           (NAN(local_2b8[(int)(local_38 * local_54 + local_3c)]) || NAN(dVar3))) {
          printf("component (%d,%d) of covar and covar1 differ: %g != %g\n",
                 local_2b8[(int)(local_38 * local_54 + local_3c)],
                 local_5b8[(int)(local_38 * local_54 + local_3c)] * dVar2,(ulong)local_38,
                 (ulong)local_3c);
        }
      }
    }
  }
  return 0;
}

Assistant:

int main()
{
#if (defined(__MINGW32__) && !defined(_UCRT)) || (defined(_MSC_VER) && (_MSC_VER < 1900))
  _set_output_format(_TWO_DIGIT_EXPONENT);
#endif
  int i, j, maxfev, mode, nprint, info, nfev, ldfjac;
  int ipvt[3];
  real ftol, xtol, gtol, epsfcn, factor, fnorm;
  real x[3], fvec[15], diag[3], fjac[15*3], qtf[3], 
    wa1[3], wa2[3], wa3[3], wa4[15];
  int k;
  const int m = 15;
  const int n = 3;
  /* auxiliary data (e.g. measurements) */
  real y[15] = {1.4e-1, 1.8e-1, 2.2e-1, 2.5e-1, 2.9e-1, 3.2e-1, 3.5e-1,
                  3.9e-1, 3.7e-1, 5.8e-1, 7.3e-1, 9.6e-1, 1.34, 2.1, 4.39};
#ifdef TEST_COVAR
  real covfac;
  real fjac1[15*3];
#endif

  fcndata_t data;
  data.m = m;
  data.y = y;

/*      the following starting values provide a rough fit. */

  x[0] = 1.;
  x[1] = 1.;
  x[2] = 1.;

  ldfjac = 15;

  /*      set ftol and xtol to the square root of the machine */
  /*      and gtol to zero. unless high solutions are */
  /*      required, these are the recommended settings. */

  ftol = sqrt(__cminpack_func__(dpmpar)(1));
  xtol = sqrt(__cminpack_func__(dpmpar)(1));
  gtol = 0.;

  maxfev = 800;
  epsfcn = 0.;
  mode = 1;
  factor = 1.e2;
  nprint = 0;

  info = __cminpack_func__(lmdif)(fcn, &data, m, n, x, fvec, ftol, xtol, gtol, maxfev, epsfcn, 
	 diag, mode, factor, nprint, &nfev, fjac, ldfjac, 
	 ipvt, qtf, wa1, wa2, wa3, wa4);

  fnorm = __cminpack_func__(enorm)(m, fvec);

  printf("      final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
  printf("      number of function evaluations%10i\n\n", nfev);
  printf("      exit parameter                %10i\n\n", info);
  printf("      final approximate solution\n");
  for (j=0; j<n; ++j) {
    printf("%s%15.7g", j%3==0?"\n     ":"", (double)x[j]);
  }
  printf("\n");
  ftol = __cminpack_func__(dpmpar)(1);
#ifdef TEST_COVAR
  /* test the original covar from MINPACK */
  covfac = fnorm*fnorm/(m-n);
  memcpy(fjac1, fjac, sizeof(fjac));
  __cminpack_func__(covar)(n, fjac1, ldfjac, ipvt, ftol, wa1);
  /*
  printf("      covariance (using covar)\n");
  for (i=0; i<n; ++i) {
    for (j=0; j<n; ++j)
      printf("%s%15.7g", j%3==1?"\n     ":"", (double)fjac1[i*ldfjac+j]*covfac);
  }
  printf("\n");
  */
#endif
  /* test covar1, which also estimates the rank of the Jacobian */
  k = __cminpack_func__(covar1)(m, n, fnorm*fnorm, fjac, ldfjac, ipvt, ftol, wa1);
  printf("      covariance\n");
  for (i=0; i<n; ++i) {
    for (j=0; j<n; ++j)
      printf("%s%15.7g", j%3==0?"\n     ":"", (double)fjac[i*ldfjac+j]);
  }
  printf("\n");
  (void)k;
#ifdef TEST_COVAR
  if (k == n) {
    /* comparison only works if covariance matrix has full rank */
    for (i=0; i<n; ++i) {
      for (j=0; j<n; ++j) {
        if (fjac[i*ldfjac+j] != fjac1[i*ldfjac+j]*covfac) {
          printf("component (%d,%d) of covar and covar1 differ: %g != %g\n", i, j, (double)fjac[i*ldfjac+j], (double)(fjac1[i*ldfjac+j]*covfac));
        }
      }
    }
  }
#endif
  /* printf("      rank(J) = %d\n", k != 0 ? k : n); */
  return 0;
}